

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurveTessellation.h
# Opt level: O0

pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
* anurbs::CurveTessellation<2L>::compute
            (pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
             *__return_storage_ptr__,CurveBaseD *curve,double tolerance)

{
  allocator<double> *this;
  type_conflict tVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  reference pvVar5;
  type_conflict *ptVar6;
  type *ptVar7;
  size_type sVar8;
  Index IVar9;
  reference pvVar10;
  reference this_00;
  Interval IVar11;
  size_type local_260;
  Index i_1;
  undefined1 local_250 [8];
  vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  locations;
  undefined1 local_230 [8];
  vector<double,_std::allocator<double>_> parameters;
  double distance;
  Vector point_1;
  double t_1;
  Index i;
  ParameterPoint max_point;
  double local_1a0;
  double max_distance;
  type *point_b;
  type *t_b;
  double local_160;
  type *local_158;
  type *point_a;
  type *t_a;
  long local_128;
  Index n;
  pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *local_118;
  pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *local_110;
  Matrix<double,_1,_2,_1,_1,_2> local_108;
  double local_f0;
  undefined1 local_e8 [8];
  Vector point;
  double local_d0;
  double t;
  double dStack_c0;
  undefined1 local_b8 [8];
  Interval normalized_span;
  Interval *span;
  iterator __end0;
  iterator __begin0;
  vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> local_80;
  vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *local_68;
  vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *__range2;
  vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  points;
  vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  sample_points;
  Interval domain;
  double tolerance_local;
  CurveBaseD *curve_local;
  
  (*curve->_vptr_CurveBase[3])();
  std::
  vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  ::vector((vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
            *)&points.
               super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  ::vector((vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
            *)&__range2);
  (*curve->_vptr_CurveBase[4])(&local_80);
  local_68 = &local_80;
  __end0 = std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>::begin(local_68);
  span = (Interval *)std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>::end(local_68)
  ;
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<anurbs::Interval_*,_std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>_>
                                     *)&span), bVar3) {
    normalized_span.m_t1 =
         (double)__gnu_cxx::
                 __normal_iterator<anurbs::Interval_*,_std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>_>
                 ::operator*(&__end0);
    t = ((reference)normalized_span.m_t1)->m_t0;
    dStack_c0 = ((reference)normalized_span.m_t1)->m_t1;
    IVar11 = Interval::normalized_interval
                       ((Interval *)
                        &sample_points.
                         super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        *(Interval *)normalized_span.m_t1);
    normalized_span.m_t0 = IVar11.m_t1;
    local_b8 = (undefined1  [8])IVar11.m_t0;
    dVar2 = Interval::length((Interval *)local_b8);
    if (1e-07 <= dVar2) {
      local_d0 = Interval::t0((Interval *)local_b8);
      dVar2 = Interval::t0((Interval *)normalized_span.m_t1);
      (*curve->_vptr_CurveBase[5])(SUB84(dVar2,0),local_e8);
      std::
      vector<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>>>
      ::emplace_back<double_const&,Eigen::Matrix<double,1,2,1,1,2>const&>
                ((vector<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>>>
                  *)&points.
                     super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_d0,
                 (Matrix<double,_1,_2,_1,_1,_2> *)local_e8);
    }
    __gnu_cxx::
    __normal_iterator<anurbs::Interval_*,_std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>_>
    ::operator++(&__end0);
  }
  std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>::~vector(&local_80);
  local_f0 = 1.0;
  dVar2 = Interval::parameter_at_normalized
                    ((Interval *)
                     &sample_points.
                      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,1.0);
  (*curve->_vptr_CurveBase[5])(SUB84(dVar2,0),&local_108);
  std::
  vector<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>>>
  ::emplace_back<double,Eigen::Matrix<double,1,2,1,1,2>>
            ((vector<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>>>
              *)&points.
                 super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_f0,&local_108);
  local_110 = (pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)
              std::
              begin<std::vector<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>>>>
                        ((vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                          *)&points.
                             super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_118 = (pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)
              std::
              end<std::vector<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>>>>
                        ((vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                          *)&points.
                             super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>*,std::vector<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>>>>,anurbs::CurveTessellation<2l>::compute(anurbs::CurveBase<2l>const&,double)::_lambda(auto:1_const&,auto:2_const&)_1_>
            (local_110,local_118);
  iVar4 = (*curve->_vptr_CurveBase[2])();
  local_128 = CONCAT44(extraout_var,iVar4) * 2 + 1;
  while( true ) {
    pvVar5 = std::
             vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
             ::back((vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                     *)&points.
                        super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::pair
              ((pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)&t_a,pvVar5);
    point_a = (type *)std::get<0ul,double,Eigen::Matrix<double,1,2,1,1,2>>
                                ((pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)&t_a);
    local_158 = std::get<1ul,double,Eigen::Matrix<double,1,2,1,1,2>>
                          ((pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)&t_a);
    std::
    vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
    ::pop_back((vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                *)&points.
                   super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_160 = Interval::parameter_at_normalized
                          ((Interval *)
                           &sample_points.
                            super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (point_a->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).
                           m_storage.m_data.array[0]);
    std::
    vector<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>>>
    ::emplace_back<double,Eigen::Matrix<double,1,2,1,1,2>const&>
              ((vector<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>>>
                *)&__range2,&local_160,local_158);
    bVar3 = std::
            vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
            ::empty((vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                     *)&points.
                        super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar3) break;
    while( true ) {
      pvVar5 = std::
               vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
               ::back((vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                       *)&points.
                          super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::pair
                ((pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)&t_b,pvVar5);
      ptVar6 = std::get<0ul,double,Eigen::Matrix<double,1,2,1,1,2>>
                         ((pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)&t_b);
      ptVar7 = std::get<1ul,double,Eigen::Matrix<double,1,2,1,1,2>>
                         ((pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)&t_b);
      local_1a0 = 0.0;
      std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::
      pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_true>
                ((pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)&i);
      for (t_1 = 4.94065645841247e-324; (long)t_1 <= local_128; t_1 = (double)((long)t_1 + 1)) {
        point_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
        [1] = Interval::parameter_at_normalized
                        ((point_a->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).
                         m_storage.m_data.array[0],*ptVar6,
                         (double)(long)t_1 / (double)(local_128 + 1));
        dVar2 = Interval::parameter_at_normalized
                          ((Interval *)
                           &sample_points.
                            super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           point_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                           m_storage.m_data.array[1]);
        (*curve->_vptr_CurveBase[5])(SUB84(dVar2,0),&distance);
        dVar2 = distance_to_line((Vector *)&distance,local_158,ptVar7);
        if (local_1a0 < dVar2) {
          std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::
          pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_true>
                    ((pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)
                     &parameters.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     point_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
                     m_data.array + 1,(Matrix<double,_1,_2,_1,_1,_2> *)&distance);
          std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::operator=
                    ((pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)&i,
                     (type)&parameters.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
          local_1a0 = dVar2;
        }
      }
      if (local_1a0 < tolerance) break;
      std::
      vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
      ::push_back((vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                   *)&points.
                      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&i);
    }
  }
  sVar8 = std::
          vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
          ::size((vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                  *)&__range2);
  this = (allocator<double> *)
         ((long)&locations.
                 super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(this);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_230,sVar8,this);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&locations.
                     super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  sVar8 = std::
          vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
          ::size((vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                  *)&__range2);
  std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::allocator
            ((allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)((long)&i_1 + 7));
  std::
  vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  ::vector((vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
            *)local_250,sVar8,(allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)((long)&i_1 + 7));
  std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::~allocator
            ((allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)((long)&i_1 + 7));
  for (local_260 = 0;
      IVar9 = length<std::vector<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>>>>
                        ((vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                          *)&__range2), (long)local_260 < IVar9; local_260 = local_260 + 1) {
    pvVar5 = std::
             vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
             ::operator[]((vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                           *)&__range2,local_260);
    ptVar6 = std::get<0ul,double,Eigen::Matrix<double,1,2,1,1,2>>(pvVar5);
    tVar1 = *ptVar6;
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)local_230,local_260);
    *pvVar10 = tVar1;
    pvVar5 = std::
             vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
             ::operator[]((vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                           *)&__range2,local_260);
    ptVar7 = std::get<1ul,double,Eigen::Matrix<double,1,2,1,1,2>>(pvVar5);
    this_00 = std::
              vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                            *)local_250,local_260);
    Eigen::Matrix<double,_1,_2,_1,_1,_2>::operator=(this_00,ptVar7);
  }
  std::
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  ::
  pair<std::vector<double,_std::allocator<double>_>_&,_std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_&,_true>
            (__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)local_230,
             (vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
              *)local_250);
  std::
  vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  ::~vector((vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
             *)local_250);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_230);
  std::
  vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  ::~vector((vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
             *)&__range2);
  std::
  vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  ::~vector((vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
             *)&points.
                super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

static std::pair<std::vector<double>, std::vector<Vector>> compute(const CurveBaseD& curve, const double tolerance)
    {
        const Interval domain = curve.domain();

        std::vector<ParameterPoint> sample_points;
        std::vector<ParameterPoint> points;

        // compute sample points

        for (const auto& span : curve.spans()) {
            const Interval normalized_span = domain.normalized_interval(span);

            if (normalized_span.length() < 1e-7) {
                continue;
            }

            const double t = normalized_span.t0();
            const Vector point = curve.point_at(span.t0());

            sample_points.emplace_back(t, point);
        }

        sample_points.emplace_back(1.0, curve.point_at(domain.parameter_at_normalized(1.0)));

        std::sort(std::begin(sample_points), std::end(sample_points),
            [](auto const& lhs, auto const& rhs) {
                return std::get<0>(lhs) > std::get<0>(rhs);
            });

        // compute polyline

        const Index n = curve.degree() * 2 + 1;

        while (true) {
            const auto [t_a, point_a] = sample_points.back();
            sample_points.pop_back();

            points.emplace_back(domain.parameter_at_normalized(t_a), point_a);

            if (sample_points.empty()) {
                break;
            }

            while (true) {
                const auto [t_b, point_b] = sample_points.back();

                double max_distance {0};
                ParameterPoint max_point;

                for (Index i = 1; i <= n; i++) {
                    const double t = Interval::parameter_at_normalized(t_a, t_b, i / double(n + 1));
                    const Vector point = curve.point_at(domain.parameter_at_normalized(t));

                    const double distance = distance_to_line(point, point_a, point_b);

                    if (distance > max_distance) {
                        max_distance = distance;
                        max_point = {t, point};
                    }
                }

                if (max_distance < tolerance) {
                    break;
                }

                sample_points.push_back(max_point);
            }
        }

        std::vector<double> parameters(points.size());
        std::vector<Vector> locations(points.size());

        for (Index i = 0; i < length(points); i++) {
            parameters[i] = std::get<0>(points[i]);
            locations[i] = std::get<1>(points[i]);
        }

        return {parameters, locations};
    }